

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExportNode.h
# Opt level: O0

void __thiscall
Assimp::FBX::Node::AddProperties<std::__cxx11::string,std::__cxx11::string>
          (Node *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *more)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *more_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value_local;
  Node *this_local;
  
  local_20 = more;
  more_local = value;
  value_local = &this->name;
  std::vector<Assimp::FBX::FBXExportProperty,std::allocator<Assimp::FBX::FBXExportProperty>>::
  emplace_back<std::__cxx11::string&>
            ((vector<Assimp::FBX::FBXExportProperty,std::allocator<Assimp::FBX::FBXExportProperty>>
              *)&this->properties,value);
  std::__cxx11::string::string((string *)&local_40,(string *)more);
  AddProperties<std::__cxx11::string>(this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void AddProperties(T value, More... more) {
        properties.emplace_back(value);
        AddProperties(more...);
    }